

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_> __thiscall
kj::anon_unknown_59::InMemoryDirectory::tryAppendFile
          (InMemoryDirectory *this,PathPtr path,WriteMode mode)

{
  _func_int **pp_Var1;
  undefined4 in_register_0000000c;
  long lVar2;
  AppendableFile *pAVar3;
  AppendableFile *extraout_RDX;
  AppendableFile *extraout_RDX_00;
  _func_int **pp_Var5;
  AppendableFile *extraout_RDX_01;
  AppendableFile *extraout_RDX_02;
  uint in_R8D;
  Mutex *this_00;
  Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_> MVar6;
  Maybe<kj::Own<const_kj::Directory,_std::nullptr_t>_> MVar7;
  StringPtr name;
  StringPtr name_00;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  undefined1 local_50 [24];
  Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *local_38;
  AppendableFile *pAVar4;
  
  lVar2 = CONCAT44(in_register_0000000c,mode);
  pAVar3 = (AppendableFile *)path.parts.size_;
  name_00.content.ptr = (Locked<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)path.parts.ptr
  ;
  if (lVar2 == 1) {
    this_00 = (Mutex *)&name_00.content.ptr[1].ptr;
    local_50[0] = (_func_Own<kj::AppendableFile,_std::nullptr_t>_Own<const_kj::File,_std::nullptr_t>
                  )0x0;
    kj::_::Mutex::lock(this_00,0);
    local_38 = name_00.content.ptr + 3;
    pp_Var1 = (pAVar3->super_OutputStream)._vptr_OutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var5 = (_func_int **)0x4b4903;
    }
    else {
      pp_Var5 = (pAVar3->super_FsNode)._vptr_FsNode;
    }
    name.content.size_ = (size_t)pp_Var5;
    name.content.ptr = (char *)local_38;
    local_50._16_8_ = this_00;
    Impl::openEntry((Impl *)local_50,name,(int)pp_Var1 + (uint)(pp_Var1 == (_func_int **)0x0));
    if (CONCAT71(local_50._1_7_,local_50[0]) == 0) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    }
    else {
      asFile((InMemoryDirectory *)local_50,name_00.content.ptr,(EntryImpl *)(local_50 + 0x10),
             (WriteMode)CONCAT71(local_50._1_7_,local_50[0]));
      MVar6 = Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>::
              map<kj::Own<kj::AppendableFile,_std::nullptr_t>_(&)(kj::Own<const_kj::File,_std::nullptr_t>)>
                        ((Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> *)this,
                         (_func_Own<kj::AppendableFile,_std::nullptr_t>_Own<const_kj::File,_std::nullptr_t>
                          *)local_50);
      pAVar4 = MVar6.ptr.ptr;
      if ((InMemoryFileFactory *)local_50._8_8_ != (InMemoryFileFactory *)0x0) {
        local_50._8_8_ = (InMemoryFileFactory *)0x0;
        (*(code *)**(undefined8 **)CONCAT71(local_50._1_7_,local_50[0]))();
        pAVar4 = extraout_RDX_00;
      }
      this_00 = (Mutex *)local_50._16_8_;
      if ((Mutex *)local_50._16_8_ == (Mutex *)0x0) goto LAB_00465a37;
    }
    kj::_::Mutex::unlock(this_00,EXCLUSIVE,(Waiter *)0x0);
    pAVar4 = extraout_RDX_02;
    goto LAB_00465a37;
  }
  if (lVar2 == 0) {
    if ((in_R8D & 2) == 0) {
      pAVar4 = pAVar3;
      if ((in_R8D & 1) != 0) goto LAB_00465a1d;
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4c7,FAILED,(char *)0x0,"\"can\'t replace self\"",
                 (char (*) [19])"can\'t replace self");
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[11]>
                ((Fault *)local_50,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x4c3,FAILED,(char *)0x0,"\"not a file\"",(char (*) [11])"not a file");
    }
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
    kj::_::Debug::Fault::~Fault((Fault *)local_50);
    pAVar4 = extraout_RDX;
  }
  else {
    pp_Var1 = (pAVar3->super_OutputStream)._vptr_OutputStream;
    if (pp_Var1 == (_func_int **)0x0) {
      pp_Var5 = (_func_int **)0x4b4903;
    }
    else {
      pp_Var5 = (pAVar3->super_FsNode)._vptr_FsNode;
    }
    name_00.content.size_ = (size_t)pp_Var5;
    MVar7 = tryGetParent((InMemoryDirectory *)local_50,name_00,
                         (int)pp_Var1 + (uint)(pp_Var1 == (_func_int **)0x0));
    pAVar4 = (AppendableFile *)MVar7.ptr.ptr;
    if ((InMemoryFileFactory *)local_50._8_8_ != (InMemoryFileFactory *)0x0) {
      (**(code **)(*(_func_int **)local_50._8_8_ + 0x80))
                (this,local_50._8_8_,&pAVar3[1].super_OutputStream,lVar2 + -1,in_R8D);
      (*(code *)**(undefined8 **)CONCAT71(local_50._1_7_,local_50[0]))
                ((undefined8 *)CONCAT71(local_50._1_7_,local_50[0]),
                 (InMemoryFileFactory *)
                 (local_50._8_8_ + *(long *)(*(_func_int **)local_50._8_8_ + -0x10)));
      pAVar4 = extraout_RDX_01;
      goto LAB_00465a37;
    }
LAB_00465a1d:
    (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
    (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  }
LAB_00465a37:
  MVar6.ptr.ptr = pAVar4;
  MVar6.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::AppendableFile,_std::nullptr_t>_>)MVar6.ptr;
}

Assistant:

Maybe<Own<AppendableFile>> tryAppendFile(PathPtr path, WriteMode mode) const override {
    if (path.size() == 0) {
      if (has(mode, WriteMode::MODIFY)) {
        KJ_FAIL_REQUIRE("not a file") { return kj::none; }
      } else if (has(mode, WriteMode::CREATE)) {
        return kj::none;  // already exists (as a directory)
      } else {
        KJ_FAIL_REQUIRE("can't replace self") { return kj::none; }
      }
    } else if (path.size() == 1) {
      auto lock = impl.lockExclusive();
      KJ_IF_SOME(entry, lock->openEntry(path[0], mode)) {
        return asFile(lock, entry, mode).map(newFileAppender);
      } else {
        return kj::none;
      }
    }